

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::GetPropertyQuery
          (CustomExternalWrapperObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  Type TVar2;
  DynamicObject *aValue;
  code *pcVar3;
  ThreadContext *this_00;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  PropertyQueryFlags PVar7;
  Attributes attributes;
  JavascriptFunction *function;
  RecyclableObject *pRVar8;
  undefined4 *puVar9;
  RecyclableObject *this_01;
  ScriptContext *pSVar10;
  PropertyDescriptor *this_02;
  PropertyDescriptor local_e8;
  undefined1 local_b8 [8];
  PropertyDescriptor result;
  Var local_58;
  Var isPropertyNameNumeric;
  Var local_48;
  ThreadContext *local_40;
  Var *local_38;
  
  local_48 = originalInstance;
  BVar6 = VerifyObjectAlive(this);
  if (BVar6 == 0) {
    return Property_NotFound;
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_b8);
  pSVar10 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar10->threadContext,0xc00,pSVar10,(PVOID)0x0);
  local_40 = requestContext->threadContext;
  BVar6 = EnsureInitialized(this,requestContext);
  if (BVar6 != 0) {
    aValue = ((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.ptr)->
             elements[0].prototypeObjectWithProperty.ptr;
    local_38 = value;
    if (((aValue == (DynamicObject *)0x0) ||
        (function = VarTo<Js::JavascriptFunction>(aValue), function == (JavascriptFunction *)0x0))
       || (pSVar10 = requestContext, bVar4 = ScriptContext::IsHeapEnumInProgress(requestContext),
          bVar4)) {
      value = local_38;
      PVar7 = DynamicObject::GetPropertyQuery
                        (&this->super_DynamicObject,local_48,propertyId,local_38,info,requestContext
                        );
      bVar4 = PVar7 == Property_Found;
      pRVar8 = (RecyclableObject *)*value;
LAB_00a0f284:
      PropertyDescriptor::SetValue((PropertyDescriptor *)local_b8,pRVar8);
    }
    else {
      GetName((CustomExternalWrapperObject *)pSVar10,requestContext,propertyId,&local_58,
              &isPropertyNameNumeric);
      this_00 = local_40;
      if (info != (PropertyValueInfo *)0x0) {
        info->m_instance = (RecyclableObject *)this;
        info->m_propertyIndex = 0xffff;
        info->m_attributes = '\0';
        info->flags = InlineCacheNoFlags;
        *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
      }
      result._40_8_ = local_40;
      bVar4 = local_40->reentrancySafeOrHandled;
      local_40->reentrancySafeOrHandled = true;
      attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
      bVar5 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
      if (bVar5) {
        pRVar8 = (RecyclableObject *)
                 anon_func::anon_class_48_6_cceed700::operator()
                           ((anon_class_48_6_cceed700 *)&result.Configurable);
        bVar5 = ThreadContext::IsOnStack(pRVar8);
        value = local_38;
        if (bVar5) {
LAB_00a0f373:
          this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
        if ((attributes & HasNoSideEffect) == None) {
          IVar1 = this_00->implicitCallFlags;
          pRVar8 = (RecyclableObject *)
                   anon_func::anon_class_48_6_cceed700::operator()
                             ((anon_class_48_6_cceed700 *)&result.Configurable);
          this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
          value = local_38;
        }
        else {
          pRVar8 = (RecyclableObject *)
                   anon_func::anon_class_48_6_cceed700::operator()
                             ((anon_class_48_6_cceed700 *)&result.Configurable);
          value = local_38;
          bVar5 = ThreadContext::IsOnStack(pRVar8);
          if (bVar5) goto LAB_00a0f373;
        }
      }
      else {
        this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
        pRVar8 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                   super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                 undefinedValue.ptr;
        value = local_38;
      }
      this_00->reentrancySafeOrHandled = bVar4;
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00a0f559;
        *puVar9 = 0;
      }
      bVar4 = TaggedInt::Is(pRVar8);
      if ((ulong)pRVar8 >> 0x32 != 0 || bVar4) {
LAB_00a0f51f:
        bVar4 = true;
        goto LAB_00a0f284;
      }
      this_01 = UnsafeVarTo<Js::RecyclableObject>(pRVar8);
      if (this_01 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00a0f559;
        *puVar9 = 0;
      }
      TVar2 = ((this_01->type).ptr)->typeId;
      if (0x57 < (int)TVar2) {
        BVar6 = RecyclableObject::IsExternal(this_01);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) {
LAB_00a0f559:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar9 = 0;
        }
        goto LAB_00a0f51f;
      }
      if (TVar2 != TypeIds_Undefined) goto LAB_00a0f51f;
      bVar4 = false;
    }
    if (bVar4) {
      this_02 = &local_e8;
      PropertyDescriptor::PropertyDescriptor(&local_e8,(PropertyDescriptor *)local_b8);
      pRVar8 = (RecyclableObject *)
               GetValueFromDescriptor
                         ((CustomExternalWrapperObject *)this_02,local_48,&local_e8,requestContext);
      PVar7 = Property_Found;
      goto LAB_00a0f2c1;
    }
  }
  pRVar8 = ScriptContext::GetMissingPropertyResult(requestContext);
  PVar7 = Property_NotFound;
LAB_00a0f2c1:
  *value = pRVar8;
  return PVar7;
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::GetPropertyQuery(Js::Var originalInstance, Js::PropertyId propertyId, Js::Var* value, Js::PropertyValueInfo* info, Js::ScriptContext* requestContext)
{
    if (!this->VerifyObjectAlive()) return Js::PropertyQueryFlags::Property_NotFound;
    Js::PropertyDescriptor result;

    auto fn = [&](Js::RecyclableObject* object)-> BOOL {
        BOOL found = JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext));
        result.SetValue(*value);
        return found;
    };
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return GetName(requestContext, propertyId, isPropertyNameNumeric, propertyNameNumericValue);
    };
    BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyName, requestContext, info);
    if (!foundProperty)
    {
        *value = requestContext->GetMissingPropertyResult();
    }
    else
    {
        *value = GetValueFromDescriptor(originalInstance, result, requestContext);
    }
    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
}